

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hh
# Opt level: O1

void __thiscall
tchecker::algorithms::couvscc::
single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::merge_scc
          (single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t> *this
          ,node_sptr_t *n,stats_t *stats)

{
  uint uVar1;
  _Elt_pointer prVar2;
  uint *puVar3;
  bool *pbVar4;
  node_sptr_t local_48;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
  local_40;
  stats_t *local_38;
  
  local_48._t = (make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>
                 *)0x0;
  local_38 = stats;
  do {
    prVar2 = (this->_roots).c.
             super__Deque_base<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (prVar2 == (this->_roots).c.
                  super__Deque_base<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      prVar2 = (this->_roots).c.
               super__Deque_base<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    if (&local_48 != &prVar2[-1].n) {
      intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
      ::reset(&local_48,prVar2[-1].n._t);
    }
    if ((node_t *)local_48._t == (node_t *)0x0) goto LAB_0012c3ce;
    if ((((local_48._t)->
         super_node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>
         ).super_node_t.super_node_t.super_node_flags_t._flags &
        ((local_48._t)->
        super_node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>
        ).super_node_t.super_node_t.super_node_flags_t.NODE_FINAL) != 0) {
      pbVar4 = stats_t::cycle(local_38);
      *pbVar4 = true;
      goto LAB_0012c3b7;
    }
    std::
    deque<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>_>
    ::pop_back(&(this->_roots).c);
    if ((node_t *)local_48._t == (node_t *)0x0) {
LAB_0012c3ce:
      __assert_fail("_t != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                    ,0x1db,
                    "T *tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t, tchecker::tck_liveness::zg_couvscc::edge_t>>>::operator->() const [T = tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t, tchecker::tck_liveness::zg_couvscc::edge_t>>]"
                   );
    }
    puVar3 = couvscc::node_t::dfsnum((node_t *)local_48._t);
    if ((node_t *)n->_t == (node_t *)0x0) goto LAB_0012c3ce;
    uVar1 = *puVar3;
    puVar3 = couvscc::node_t::dfsnum((node_t *)n->_t);
  } while (*puVar3 < uVar1);
  local_40._t = (make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>
                 *)0x0;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
  ::reset(&local_40,local_48._t);
  std::
  deque<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,std::allocator<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>>
  ::
  emplace_back<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>
            ((deque<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,std::allocator<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>>
              *)&this->_roots,(roots_stack_entry_t *)&local_40);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
  ::~intrusive_shared_ptr_t(&local_40);
LAB_0012c3b7:
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
  ::~intrusive_shared_ptr_t(&local_48);
  return;
}

Assistant:

void merge_scc(node_sptr_t & n, tchecker::algorithms::couvscc::stats_t & stats)
  {
    node_sptr_t u{nullptr};
    do {
      u = _roots.top().n;
      if (u->final()) {
        stats.cycle() = true;
        return;
      }
      _roots.pop();
    } while (u->dfsnum() > n->dfsnum());
    _roots.push(roots_stack_entry_t{u});
  }